

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_test.c
# Opt level: O0

void CheckGet(leveldb_t *db,leveldb_readoptions_t *options,char *key,char *expected)

{
  size_t keylen;
  char *local_40;
  char *val;
  size_t val_len;
  char *err;
  char *expected_local;
  char *key_local;
  leveldb_readoptions_t *options_local;
  leveldb_t *db_local;
  
  val_len = 0;
  err = expected;
  expected_local = key;
  key_local = (char *)options;
  options_local = (leveldb_readoptions_t *)db;
  keylen = strlen(key);
  local_40 = leveldb_get(db,options,key,keylen,(size_t *)&val,(char **)&val_len);
  if (val_len != 0) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/c_test.c"
            ,0x3f,phase,val_len);
    abort();
  }
  CheckEqual(err,local_40,(size_t)val);
  Free(&local_40);
  return;
}

Assistant:

static void CheckGet(
    leveldb_t* db,
    const leveldb_readoptions_t* options,
    const char* key,
    const char* expected) {
  char* err = NULL;
  size_t val_len;
  char* val;
  val = leveldb_get(db, options, key, strlen(key), &val_len, &err);
  CheckNoError(err);
  CheckEqual(expected, val, val_len);
  Free(&val);
}